

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O1

void __thiscall
ConfidentialTxOut_Constractor6_Test::TestBody(ConfidentialTxOut_Constractor6_Test *this)

{
  bool *pbVar1;
  undefined1 lhs [8];
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  Amount AVar7;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  ConfidentialTxOut txout;
  ElementsConfidentialAddress address;
  undefined1 local_368 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  undefined1 local_340 [56];
  undefined1 local_308 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  char local_2f8 [16];
  ulong local_2e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  int64_t local_2d8;
  Amount local_2d0;
  ConfidentialTxOut local_2c0;
  ElementsConfidentialAddress local_1c8;
  
  pbVar1 = &local_2c0.super_AbstractTxOut.value_.ignore_check_;
  local_2c0.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,
             "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
             ,"");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_1c8,(string *)&local_2c0);
  if (local_2c0.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)pbVar1) {
    operator_delete(local_2c0.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  AVar7 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_2d0.amount_ = AVar7.amount_;
  local_2d0.ignore_check_ = AVar7.ignore_check_;
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&local_2c0,&local_1c8,&exp_asset,&local_2d0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_340,&local_2c0.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_368,(ConfidentialAssetId *)local_340);
  lhs = local_368;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_308,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2e8,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()"
             ,(char *)lhs,(char *)local_308);
  if (local_308 != (undefined1  [8])local_2f8) {
    operator_delete((void *)local_308);
  }
  if (local_368 != (undefined1  [8])&local_358) {
    operator_delete((void *)local_368);
  }
  local_340._0_8_ = &PTR__ConfidentialAssetId_006a21d8;
  if ((pointer)local_340._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_2e8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (local_2e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_2e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xba,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_340._0_8_ + 8))();
      }
      local_340._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_340,&local_2c0.confidential_value_);
  AVar7 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)local_340);
  local_308 = (undefined1  [8])AVar7.amount_;
  local_300.ptr_._0_1_ = AVar7.ignore_check_;
  local_2e8 = cfd::core::Amount::GetSatoshiValue((Amount *)local_308);
  local_2d8 = cfd::core::Amount::GetSatoshiValue(&local_2d0);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_368,"txout.GetConfidentialValue().GetAmount().GetSatoshiValue()",
             "amount.GetSatoshiValue()",(long *)&local_2e8,&local_2d8);
  local_340._0_8_ = &PTR__ConfidentialValue_006a2070;
  if ((pointer)local_340._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_368[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (sStack_360.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((sStack_360.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xbc,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_308,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_308);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_340._0_8_ + 8))();
      }
      local_340._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_360,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_340,&local_2c0.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_368,(Script *)local_340);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_308,"txout.GetLockingScript().GetHex().c_str()",
             "\"0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6\"",
             (char *)local_368,
             "0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6");
  if (local_368 != (undefined1  [8])&local_358) {
    operator_delete((void *)local_368);
  }
  cfd::core::Script::~Script((Script *)local_340);
  if (local_308[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if ((undefined8 *)CONCAT71(local_300.ptr_._1_7_,local_300.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(local_300.ptr_._1_7_,local_300.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xbe,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_340._0_8_ + 8))();
      }
      local_340._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_300,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_340,&local_2c0.nonce_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_368,(ConfidentialNonce *)local_340);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_308,"txout.GetNonce().GetHex().c_str()",
             "\"03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800\"",
             (char *)local_368,"03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800")
  ;
  if (local_368 != (undefined1  [8])&local_358) {
    operator_delete((void *)local_368);
  }
  local_340._0_8_ = &PTR__ConfidentialNonce_006a23c0;
  if ((pointer)local_340._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_308[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if ((undefined8 *)CONCAT71(local_300.ptr_._1_7_,local_300.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(local_300.ptr_._1_7_,local_300.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_340._0_8_ + 8))();
      }
      local_340._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_300,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368 = (undefined1  [8])0x0;
  sStack_360.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_358._M_allocated_capacity = 0;
  uVar4 = (long)local_2c0.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_2c0.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar4);
  }
  local_358._M_allocated_capacity = uVar4 + (long)pbVar3;
  sVar5 = (long)local_2c0.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_2c0.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_368 = (undefined1  [8])pbVar3;
  if (sVar5 != 0) {
    sStack_360.ptr_ = pbVar3;
    memmove(pbVar3,local_2c0.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  sStack_360.ptr_ = pbVar3 + sVar5;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_340,(ByteData *)local_368);
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_308,"txout.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)local_340._0_8_,"");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_340 + 0x10))
  {
    operator_delete((void *)local_340._0_8_);
  }
  if (local_368 != (undefined1  [8])0x0) {
    operator_delete((void *)local_368);
  }
  if (local_308[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if ((undefined8 *)CONCAT71(local_300.ptr_._1_7_,local_300.ptr_._0_1_) != (undefined8 *)0x0) {
      pcVar6 = *(char **)CONCAT71(local_300.ptr_._1_7_,local_300.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_340._0_8_ + 8))();
      }
      local_340._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_300,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_368 = (undefined1  [8])0x0;
  sStack_360.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_358._M_allocated_capacity = 0;
  uVar4 = (long)local_2c0.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_2c0.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar4);
  }
  local_358._M_allocated_capacity = uVar4 + (long)pbVar3;
  sVar5 = (long)local_2c0.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_2c0.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_368 = (undefined1  [8])pbVar3;
  if (sVar5 != 0) {
    sStack_360.ptr_ = pbVar3;
    memmove(pbVar3,local_2c0.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  sStack_360.ptr_ = pbVar3 + sVar5;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_340,(ByteData *)local_368);
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_308,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)local_340._0_8_,"");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_340 + 0x10))
  {
    operator_delete((void *)local_340._0_8_);
  }
  if (local_368 != (undefined1  [8])0x0) {
    operator_delete((void *)local_368);
  }
  if (local_308[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if ((undefined8 *)CONCAT71(local_300.ptr_._1_7_,local_300.ptr_._0_1_) != (undefined8 *)0x0) {
      pcVar6 = *(char **)CONCAT71(local_300.ptr_._1_7_,local_300.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_340._0_8_ + 8))();
      }
      local_340._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_300,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar7 = cfd::core::AbstractTxOut::GetValue(&local_2c0.super_AbstractTxOut);
  local_368 = (undefined1  [8])AVar7.amount_;
  sStack_360.ptr_._0_1_ = AVar7.ignore_check_;
  local_308 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue((Amount *)local_368);
  local_2e8 = local_2e8 & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_340,"txout.GetValue().GetSatoshiValue()","0",(long *)local_308,
             (int *)&local_2e8);
  if (local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_368);
    if ((pointer)local_340._8_8_ == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc3,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_308,(Message *)local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_308);
    if (local_368 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_368 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_368 + 8))();
      }
      local_368 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_2c0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_1c8);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Setter) {
  ConfidentialTxOut txout;

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5");

  txout.SetValue(Amount::CreateBySatoshiAmount(100000000));

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
      "010000000005f5e100");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  txout.SetCommitment(exp_asset, exp_value, exp_nonce, exp_surjection_proof,
                      exp_range_proof);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(),
               exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 100000000);
}